

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpillPointers.cpp
# Opt level: O3

void __thiscall
wasm::SpillPointers::visitSpillable<wasm::CallIndirect>(SpillPointers *this,CallIndirect *curr)

{
  BasicBlock *pBVar1;
  mapped_type ppEVar2;
  mapped_type *pppEVar3;
  mapped_type local_28;
  Expression **pointer;
  
  pBVar1 = (this->
           super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
           ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
           super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
           .currBasicBlock;
  if (pBVar1 != (BasicBlock *)0x0) {
    local_28 = (this->
               super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
               ).
               super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
               .super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.replacep
    ;
    std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
    emplace_back<wasm::Expression**&>
              ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
               &(pBVar1->contents).actions,&local_28);
    ppEVar2 = local_28;
    pppEVar3 = std::__detail::
               _Map_base<wasm::Expression_**,_std::pair<wasm::Expression_**const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Expression_**const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_**>,_std::hash<wasm::Expression_**>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_**,_std::pair<wasm::Expression_**const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Expression_**const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_**>,_std::hash<wasm::Expression_**>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->actualPointers,&local_28);
    *pppEVar3 = ppEVar2;
  }
  return;
}

Assistant:

void visitSpillable(T* curr) {
    // if in unreachable code, ignore
    if (!currBasicBlock) {
      return;
    }
    auto* pointer = getCurrentPointer();
    currBasicBlock->contents.actions.emplace_back(pointer);
    // starts out as correct, may change later
    actualPointers[pointer] = pointer;
  }